

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxRectsBinPack.cpp
# Opt level: O0

Rect * __thiscall
rbp::MaxRectsBinPack::Insert
          (Rect *__return_storage_ptr__,MaxRectsBinPack *this,int width,int height,
          FreeRectChoiceHeuristic method)

{
  Rect freeNode;
  bool bVar1;
  reference pvVar2;
  __normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_> local_c8;
  __normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_> local_c0;
  const_iterator local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  uint32_t local_a0;
  size_type local_98;
  size_t i;
  size_t numRectanglesToProcess;
  int local_80;
  int iStack_7c;
  uint32_t local_78;
  Rect local_74;
  Rect local_60;
  Rect local_4c;
  Rect local_38;
  int local_24;
  int local_20;
  int score2;
  int score1;
  FreeRectChoiceHeuristic method_local;
  int height_local;
  int width_local;
  MaxRectsBinPack *this_local;
  
  score2 = method;
  score1 = height;
  method_local = width;
  _height_local = this;
  local_20 = std::numeric_limits<int>::max();
  local_24 = std::numeric_limits<int>::max();
  switch(score2) {
  case 0:
    FindPositionForNewNodeBestShortSideFit(&local_38,this,method_local,score1,&local_20,&local_24);
    __return_storage_ptr__->x = local_38.x;
    __return_storage_ptr__->y = local_38.y;
    __return_storage_ptr__->width = local_38.width;
    __return_storage_ptr__->height = local_38.height;
    __return_storage_ptr__->tag = local_38.tag;
    break;
  case 1:
    FindPositionForNewNodeBestLongSideFit(&local_74,this,method_local,score1,&local_24,&local_20);
    __return_storage_ptr__->x = local_74.x;
    __return_storage_ptr__->y = local_74.y;
    __return_storage_ptr__->width = local_74.width;
    __return_storage_ptr__->height = local_74.height;
    __return_storage_ptr__->tag = local_74.tag;
    break;
  case 2:
    FindPositionForNewNodeBestAreaFit
              ((Rect *)&numRectanglesToProcess,this,method_local,score1,&local_20,&local_24);
    __return_storage_ptr__->x = (undefined4)numRectanglesToProcess;
    __return_storage_ptr__->y = numRectanglesToProcess._4_4_;
    __return_storage_ptr__->width = local_80;
    __return_storage_ptr__->height = iStack_7c;
    __return_storage_ptr__->tag = local_78;
    break;
  case 3:
    FindPositionForNewNodeBottomLeft(&local_4c,this,method_local,score1,&local_20,&local_24);
    __return_storage_ptr__->x = local_4c.x;
    __return_storage_ptr__->y = local_4c.y;
    __return_storage_ptr__->width = local_4c.width;
    __return_storage_ptr__->height = local_4c.height;
    __return_storage_ptr__->tag = local_4c.tag;
    break;
  case 4:
    FindPositionForNewNodeContactPoint(&local_60,this,method_local,score1,&local_20);
    __return_storage_ptr__->x = local_60.x;
    __return_storage_ptr__->y = local_60.y;
    __return_storage_ptr__->width = local_60.width;
    __return_storage_ptr__->height = local_60.height;
    __return_storage_ptr__->tag = local_60.tag;
  }
  if (__return_storage_ptr__->height != 0) {
    i = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::size(&this->freeRectangles);
    for (local_98 = 0; local_98 < i; local_98 = local_98 + 1) {
      pvVar2 = std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::operator[]
                         (&this->freeRectangles,local_98);
      local_b0._0_4_ = pvVar2->x;
      local_b0._4_4_ = pvVar2->y;
      local_a8._0_4_ = pvVar2->width;
      local_a8._4_4_ = pvVar2->height;
      local_a0 = pvVar2->tag;
      freeNode.x = pvVar2->x;
      freeNode.y = pvVar2->y;
      freeNode.width = pvVar2->width;
      freeNode.height = pvVar2->height;
      freeNode.tag = pvVar2->tag;
      bVar1 = SplitFreeNode(this,freeNode,__return_storage_ptr__);
      if (bVar1) {
        local_c8._M_current =
             (Rect *)std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::begin
                               (&this->freeRectangles);
        local_c0 = __gnu_cxx::
                   __normal_iterator<rbp::Rect_*,_std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>_>
                   ::operator+(&local_c8,local_98);
        __gnu_cxx::
        __normal_iterator<rbp::Rect_const*,std::vector<rbp::Rect,std::allocator<rbp::Rect>>>::
        __normal_iterator<rbp::Rect*>
                  ((__normal_iterator<rbp::Rect_const*,std::vector<rbp::Rect,std::allocator<rbp::Rect>>>
                    *)&local_b8,&local_c0);
        std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::erase(&this->freeRectangles,local_b8);
        local_98 = local_98 - 1;
        i = i - 1;
      }
    }
    PruneFreeList(this);
    std::vector<rbp::Rect,_std::allocator<rbp::Rect>_>::push_back
              (&this->usedRectangles,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Rect MaxRectsBinPack::Insert(int width, int height, FreeRectChoiceHeuristic method)
	{
		Rect newNode;
		// Unused in this function. We don't need to know the score after finding the position.
		int score1 = std::numeric_limits<int>::max();
		int score2 = std::numeric_limits<int>::max();
		switch (method)
		{
		case RectBestShortSideFit: newNode = FindPositionForNewNodeBestShortSideFit(width, height, score1, score2);
			break;
		case RectBottomLeftRule: newNode = FindPositionForNewNodeBottomLeft(width, height, score1, score2);
			break;
		case RectContactPointRule: newNode = FindPositionForNewNodeContactPoint(width, height, score1);
			break;
		case RectBestLongSideFit: newNode = FindPositionForNewNodeBestLongSideFit(width, height, score2, score1);
			break;
		case RectBestAreaFit: newNode = FindPositionForNewNodeBestAreaFit(width, height, score1, score2);
			break;
		}

		if (newNode.height == 0)
			return newNode;

		size_t numRectanglesToProcess = freeRectangles.size();
		for (size_t i = 0; i < numRectanglesToProcess; ++i)
		{
			if (SplitFreeNode(freeRectangles[i], newNode))
			{
				freeRectangles.erase(freeRectangles.begin() + i);
				--i;
				--numRectanglesToProcess;
			}
		}

		PruneFreeList();

		usedRectangles.push_back(newNode);
		return newNode;
	}